

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.cc
# Opt level: O0

String __thiscall testing::internal::CapturedStream::ReadEntireFile(CapturedStream *this,FILE *file)

{
  size_t sVar1;
  char *buffer_00;
  size_t sVar2;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  String SVar3;
  bool local_51;
  ulong local_38;
  size_t bytes_read;
  size_t bytes_last_read;
  char *buffer;
  size_t file_size;
  FILE *file_local;
  String *content;
  
  sVar1 = GetFileSize(file);
  buffer_00 = (char *)operator_new__(sVar1);
  local_38 = 0;
  fseek((FILE *)file,0,0);
  do {
    sVar2 = fread(buffer_00 + local_38,1,sVar1 - local_38,(FILE *)file);
    local_38 = sVar2 + local_38;
    local_51 = sVar2 != 0 && local_38 < sVar1;
  } while (local_51);
  String::String((String *)this,buffer_00,local_38);
  sVar1 = extraout_RDX;
  if (buffer_00 != (char *)0x0) {
    operator_delete__(buffer_00);
    sVar1 = extraout_RDX_00;
  }
  SVar3.length_ = sVar1;
  SVar3.c_str_ = (char *)this;
  return SVar3;
}

Assistant:

String CapturedStream::ReadEntireFile(FILE* file) {
  const size_t file_size = GetFileSize(file);
  char* const buffer = new char[file_size];

  size_t bytes_last_read = 0;  // # of bytes read in the last fread()
  size_t bytes_read = 0;       // # of bytes read so far

  fseek(file, 0, SEEK_SET);

  // Keeps reading the file until we cannot read further or the
  // pre-determined file size is reached.
  do {
    bytes_last_read = fread(buffer+bytes_read, 1, file_size-bytes_read, file);
    bytes_read += bytes_last_read;
  } while (bytes_last_read > 0 && bytes_read < file_size);

  const String content(buffer, bytes_read);
  delete[] buffer;

  return content;
}